

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Video.cpp
# Opt level: O2

ssize_t __thiscall Atari::ST::Video::write(Video *this,int __fd,void *__buf,size_t __n)

{
  uint *in_RAX;
  ssize_t extraout_RAX;
  uint *extraout_RAX_00;
  ulong uVar1;
  uint uVar2;
  ulong uVar3;
  _Any_data local_38;
  code *local_28;
  code *local_20;
  
  uVar2 = __fd & 0x3f;
  if (uVar2 < 0x31) {
    uVar1 = (ulong)__buf & 0xffffffff;
    in_RAX = &switchD_002df9d8::switchdataD_0045f8e4;
    switch(uVar2) {
    case 0:
      in_RAX = (uint *)((ulong)__buf & 0xff);
      *(short *)((long)&this->base_address_ + 2) = (short)in_RAX;
      break;
    case 1:
      uVar2 = this->base_address_ & 0xff00ff;
      in_RAX = (uint *)(ulong)uVar2;
      this->base_address_ = ((uint)__buf & 0xff) << 8 | uVar2;
      break;
    case 5:
      local_38._8_8_ = (ulong)__buf & 0xffff;
      local_20 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/ST/Video.cpp:493:35)>
                 ::_M_invoke;
      local_28 = std::
                 _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/MaddTheSane[P]CLK/Machines/Atari/ST/Video.cpp:493:35)>
                 ::_M_manager;
      local_38._M_unused._M_object = this;
      DeferredQueue<HalfCycles>::defer
                (&this->deferrer_,(HalfCycles)0x2,(function<void_()> *)&local_38);
      std::_Function_base::~_Function_base((_Function_base *)&local_38);
      in_RAX = extraout_RAX_00;
      break;
    case 0x20:
      VideoStream::will_change_border_colour(&this->video_stream_);
    case 0x21:
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x26:
    case 0x27:
    case 0x28:
    case 0x29:
    case 0x2a:
    case 0x2b:
    case 0x2c:
    case 0x2d:
    case 0x2e:
    case 0x2f:
      uVar3 = (ulong)(uVar2 - 0x20);
      this->raw_palette_[uVar3] = (uint16_t)uVar1;
      in_RAX = (uint *)(uVar1 >> 7 & 0x1ffff0e);
      *(char *)(this->palette_ + uVar3) = (char)in_RAX;
      *(byte *)((long)this->palette_ + uVar3 * 2 + 1) = (char)uVar1 * '\x02' & 0xee;
      break;
    case 0x30:
      this->video_mode_ = (uint16_t)uVar1;
      update_output_mode(this);
      return extraout_RAX;
    }
  }
  return (ssize_t)in_RAX;
}

Assistant:

void Video::write(int address, uint16_t value) {
	address &= 0x3f;
	switch(address) {
		default: break;

		// Start address.
		case 0x00:	base_address_ = (base_address_ & 0x00ffff) | ((value & 0xff) << 16);	break;
		case 0x01:	base_address_ = (base_address_ & 0xff00ff) | ((value & 0xff) << 8);		break;

		// Sync mode and pixel mode.
		case 0x05:
			// Writes to sync mode have a one-cycle delay in effect.
			deferrer_.defer(HalfCycles(2), [this, value] {
				sync_mode_ = value;
				update_output_mode();
			});
		break;
		case 0x30:
			video_mode_ = value;
			update_output_mode();
		break;

		// Palette.
		case 0x20:	case 0x21:	case 0x22:	case 0x23:
		case 0x24:	case 0x25:	case 0x26:	case 0x27:
		case 0x28:	case 0x29:	case 0x2a:	case 0x2b:
		case 0x2c:	case 0x2d:	case 0x2e:	case 0x2f: {
			if(address == 0x20) video_stream_.will_change_border_colour();

			raw_palette_[address - 0x20] = value;
			uint8_t *const entry = reinterpret_cast<uint8_t *>(&palette_[address - 0x20]);
			entry[0] = uint8_t((value & 0x700) >> 7);
			entry[1] = uint8_t((value & 0x77) << 1);
		} break;
	}
}